

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

void __thiscall kj::TlsContext::TlsContext(TlsContext *this,Options *options)

{
  X509 *pXVar1;
  SSL_CTX *pSVar2;
  int iVar3;
  SSL_METHOD *meth;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  X509 *pXVar7;
  Timer **ppTVar8;
  Maybe<kj::Function<void_(kj::Exception_&&)>_> *other;
  Type *func;
  Fault local_f0;
  Timer *local_e8;
  Timer *_kj_result;
  Quantity<long,_kj::_::NanosecondLabel> *timeout;
  Quantity<long,_kj::_::NanosecondLabel> *_timeout867;
  TlsSniCallback *sni;
  TlsSniCallback *_sni862;
  X509 *x509;
  size_t i;
  TlsKeypair *kp;
  TlsKeypair *_kp839;
  StringPtr *curves;
  StringPtr *_curves832;
  long optionFlags;
  TlsCertificate *cert;
  TlsCertificate *__end2;
  TlsCertificate *__begin2;
  ArrayPtr<const_kj::TlsCertificate> *__range2;
  X509_STORE *store;
  undefined1 *local_58;
  undefined1 local_50 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:775:3)>
  _kjDefer775;
  SSL_CTX *pSStack_30;
  UnwindDetector _kjUnwindDetector775;
  SSL_CTX *ctx;
  Options *options_local;
  TlsContext *this_local;
  
  SecureNetworkWrapper::SecureNetworkWrapper(&this->super_SecureNetworkWrapper);
  (this->super_SecureNetworkWrapper)._vptr_SecureNetworkWrapper =
       (_func_int **)&PTR_wrapServer_00c15b70;
  Maybe<kj::Timer_&>::Maybe(&this->timer);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&this->acceptTimeout);
  Maybe<kj::Function<void_(kj::Exception_&&)>_>::Maybe(&this->acceptErrorHandler);
  anon_unknown_307::ensureOpenSslInitialized();
  meth = (SSL_METHOD *)TLS_method();
  pSStack_30 = SSL_CTX_new(meth);
  if (pSStack_30 == (SSL_CTX *)0x0) {
    anon_unknown_307::throwOpensslError();
  }
  UnwindDetector::UnwindDetector((UnwindDetector *)((long)&_kjDefer775.maybeFunc.ptr.field_1 + 0xc))
  ;
  store = (X509_STORE *)((long)&_kjDefer775.maybeFunc.ptr.field_1 + 0xc);
  local_58 = (undefined1 *)&stack0xffffffffffffffd0;
  defer<kj::TlsContext::TlsContext(kj::TlsContext::Options)::__0>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:775:3)>
              *)local_50,(kj *)&store,func);
  if (((options->useSystemTrustStore & 1U) != 0) &&
     (iVar3 = SSL_CTX_set_default_verify_paths(pSStack_30), iVar3 == 0)) {
    anon_unknown_307::throwOpensslError();
  }
  sVar4 = ArrayPtr<const_kj::TlsCertificate>::size(&options->trustedCertificates);
  if (sVar4 != 0) {
    __range2 = (ArrayPtr<const_kj::TlsCertificate> *)SSL_CTX_get_cert_store(pSStack_30);
    if ((X509_STORE *)__range2 == (X509_STORE *)0x0) {
      anon_unknown_307::throwOpensslError();
    }
    __begin2 = (TlsCertificate *)&options->trustedCertificates;
    __end2 = ArrayPtr<const_kj::TlsCertificate>::begin
                       ((ArrayPtr<const_kj::TlsCertificate> *)__begin2);
    cert = ArrayPtr<const_kj::TlsCertificate>::end((ArrayPtr<const_kj::TlsCertificate> *)__begin2);
    for (; __end2 != cert; __end2 = __end2 + 1) {
      optionFlags = (long)__end2;
      iVar3 = X509_STORE_add_cert((X509_STORE *)__range2,(X509 *)__end2->chain[0]);
      if (iVar3 == 0) {
        anon_unknown_307::throwOpensslError();
      }
    }
  }
  if ((options->verifyClients & 1U) != 0) {
    SSL_CTX_set_verify(pSStack_30,3,(callback *)0x0);
  }
  _curves832 = (StringPtr *)0x0;
  if (0 < (int)options->minVersion) {
    _curves832 = (StringPtr *)0x2000000;
  }
  if (1 < (int)options->minVersion) {
    _curves832 = (StringPtr *)((ulong)_curves832 | 0x4000000);
  }
  if (2 < (int)options->minVersion) {
    _curves832 = (StringPtr *)((ulong)_curves832 | 0x10000000);
  }
  if (3 < (int)options->minVersion) {
    _curves832 = (StringPtr *)((ulong)_curves832 | 0x8000000);
  }
  if (4 < (int)options->minVersion) {
    _curves832 = (StringPtr *)((ulong)_curves832 | 0x20000000);
  }
  SSL_CTX_set_options(pSStack_30,_curves832);
  pSVar2 = pSStack_30;
  pcVar5 = StringPtr::cStr(&options->cipherList);
  iVar3 = SSL_CTX_set_cipher_list(pSVar2,pcVar5);
  if (iVar3 != 0) {
    curves = kj::_::readMaybe<kj::StringPtr>(&options->curveList);
    pSVar2 = pSStack_30;
    if ((TlsKeypair *)curves != (TlsKeypair *)0x0) {
      _kp839 = (TlsKeypair *)curves;
      pcVar5 = StringPtr::cStr(curves);
      lVar6 = SSL_CTX_ctrl(pSVar2,0x5c,0,pcVar5);
      if (lVar6 == 0) {
        anon_unknown_307::throwOpensslError();
      }
    }
    kp = kj::_::readMaybe<kj::TlsKeypair_const>(&options->defaultKeypair);
    if (kp != (TlsKeypair *)0x0) {
      i = (size_t)kp;
      iVar3 = SSL_CTX_use_PrivateKey(pSStack_30,(EVP_PKEY *)(kp->privateKey).pkey);
      if (iVar3 == 0) {
        anon_unknown_307::throwOpensslError();
      }
      iVar3 = SSL_CTX_use_certificate(pSStack_30,*(X509 **)(i + 8));
      if (iVar3 == 0) {
        anon_unknown_307::throwOpensslError();
      }
      x509 = (X509 *)0x1;
      while ((pXVar1 = x509, pXVar7 = (X509 *)size<void*const,10ul>((void *(*) [10])(i + 8)),
             pXVar1 < pXVar7 &&
             (_sni862 = *(TlsSniCallback **)(i + 8 + (long)x509 * 8),
             _sni862 != (TlsSniCallback *)0x0))) {
        lVar6 = SSL_CTX_ctrl(pSStack_30,0xe,0,_sni862);
        if (lVar6 == 0) {
          anon_unknown_307::throwOpensslError();
        }
        X509_up_ref(_sni862);
        x509 = x509 + 1;
      }
    }
    sni = kj::_::readMaybe<kj::TlsSniCallback>(&options->sniCallback);
    if (sni != (TlsSniCallback *)0x0) {
      _timeout867 = (Quantity<long,_kj::_::NanosecondLabel> *)sni;
      SSL_CTX_callback_ctrl(pSStack_30,0x35,SniCallback::callback);
      SSL_CTX_ctrl(pSStack_30,0x36,0,_timeout867);
    }
    timeout = kj::_::readMaybe<kj::Quantity<long,kj::_::NanosecondLabel>>(&options->acceptTimeout);
    if ((Timer *)timeout != (Timer *)0x0) {
      _kj_result = (Timer *)timeout;
      local_e8 = kj::_::readMaybe<kj::Timer>(&options->timer);
      if (local_e8 == (Timer *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
                  (&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                   ,0x365,FAILED,"options.timer != nullptr",
                   "\"acceptTimeout option requires that a timer is also provided\"",
                   (char (*) [60])"acceptTimeout option requires that a timer is also provided");
        kj::_::Debug::Fault::fatal(&local_f0);
      }
      ppTVar8 = mv<kj::Timer*>(&local_e8);
      Maybe<kj::Timer_&>::operator=(&this->timer,*ppTVar8);
      Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::operator=
                (&this->acceptTimeout,(Quantity<long,_kj::_::NanosecondLabel> *)_kj_result);
    }
    other = mv<kj::Maybe<kj::Function<void(kj::Exception&&)>>>(&options->acceptErrorHandler);
    Maybe<kj::Function<void_(kj::Exception_&&)>_>::operator=(&this->acceptErrorHandler,other);
    this->ctx = pSStack_30;
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:775:3)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:775:3)>
                 *)local_50);
    return;
  }
  anon_unknown_307::throwOpensslError();
}

Assistant:

TlsContext::TlsContext(Options options) {
  ensureOpenSslInitialized();

#if OPENSSL_VERSION_NUMBER >= 0x10100000L || defined(OPENSSL_IS_BORINGSSL)
  SSL_CTX* ctx = SSL_CTX_new(TLS_method());
#else
  SSL_CTX* ctx = SSL_CTX_new(SSLv23_method());
#endif

  if (ctx == nullptr) {
    throwOpensslError();
  }
  KJ_ON_SCOPE_FAILURE(SSL_CTX_free(ctx));

  // honor options.useSystemTrustStore
  if (options.useSystemTrustStore) {
    if (!SSL_CTX_set_default_verify_paths(ctx)) {
      throwOpensslError();
    }
#ifdef _WIN32
    updateOpenSSLCAStoreWithWindowsCertificates(ctx);
#endif
  }

  // honor options.trustedCertificates
  if (options.trustedCertificates.size() > 0) {
    X509_STORE* store = SSL_CTX_get_cert_store(ctx);
    if (store == nullptr) {
      throwOpensslError();
    }
    for (auto& cert: options.trustedCertificates) {
      if (!X509_STORE_add_cert(store, reinterpret_cast<X509*>(cert.chain[0]))) {
        throwOpensslError();
      }
    }
  }

  if (options.verifyClients) {
    SSL_CTX_set_verify(ctx, SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT, NULL);
  }

  // honor options.minVersion
  long optionFlags = 0;
  if (options.minVersion > TlsVersion::SSL_3) {
    optionFlags |= SSL_OP_NO_SSLv3;
  }
  if (options.minVersion > TlsVersion::TLS_1_0) {
    optionFlags |= SSL_OP_NO_TLSv1;
  }
  if (options.minVersion > TlsVersion::TLS_1_1) {
    optionFlags |= SSL_OP_NO_TLSv1_1;
  }
  if (options.minVersion > TlsVersion::TLS_1_2) {
    optionFlags |= SSL_OP_NO_TLSv1_2;
  }
  if (options.minVersion > TlsVersion::TLS_1_3) {
#ifdef SSL_OP_NO_TLSv1_3
    optionFlags |= SSL_OP_NO_TLSv1_3;
#else
    KJ_FAIL_REQUIRE("OpenSSL headers don't support TLS 1.3");
#endif
  }
  SSL_CTX_set_options(ctx, optionFlags);  // note: never fails; returns new options bitmask

  // honor options.cipherList
  if (!SSL_CTX_set_cipher_list(ctx, options.cipherList.cStr())) {
    throwOpensslError();
  }

  KJ_IF_SOME(curves, options.curveList) {
    if (!SSL_CTX_set1_curves_list(ctx, curves.cStr())){
      throwOpensslError();
    }
  }

  // honor options.defaultKeypair
  KJ_IF_SOME(kp, options.defaultKeypair) {
    if (!SSL_CTX_use_PrivateKey(ctx, reinterpret_cast<EVP_PKEY*>(kp.privateKey.pkey))) {
      throwOpensslError();
    }

    if (!SSL_CTX_use_certificate(ctx, reinterpret_cast<X509*>(kp.certificate.chain[0]))) {
      throwOpensslError();
    }

    for (size_t i = 1; i < kj::size(kp.certificate.chain); i++) {
      X509* x509 = reinterpret_cast<X509*>(kp.certificate.chain[i]);
      if (x509 == nullptr) break;  // end of chain

      if (!SSL_CTX_add_extra_chain_cert(ctx, x509)) {
        throwOpensslError();
      }

      // SSL_CTX_add_extra_chain_cert() does NOT up the refcount itself.
      X509_up_ref(x509);
    }
  }

  // honor options.sniCallback
  KJ_IF_SOME(sni, options.sniCallback) {
    SSL_CTX_set_tlsext_servername_callback(ctx, &SniCallback::callback);
    SSL_CTX_set_tlsext_servername_arg(ctx, &sni);
  }

  KJ_IF_SOME(timeout, options.acceptTimeout) {
    this->timer = KJ_REQUIRE_NONNULL(options.timer,
        "acceptTimeout option requires that a timer is also provided");
    this->acceptTimeout = timeout;
  }

  this->acceptErrorHandler = kj::mv(options.acceptErrorHandler);

  this->ctx = ctx;
}